

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void windowReturnOneRow(WindowCodeArg *p)

{
  Parse *pParse_00;
  Window *pMWin;
  Vdbe *p_00;
  FuncDef *pFVar1;
  char *pcVar2;
  Window *pWVar3;
  byte bVar4;
  int iVar5;
  KeyInfo *p_01;
  int *piVar6;
  int iVar7;
  Op *pOVar8;
  int p1;
  int iVar9;
  int iVar10;
  int iVar11;
  int op;
  int p3;
  int iVar12;
  Parse *pParse;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_54;
  
  pParse_00 = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  pWVar3 = pMWin;
  if (pMWin->regStartRowid == 0) {
    for (; pWVar3 != (Window *)0x0; pWVar3 = pWVar3->pNextWin) {
      pFVar1 = pWVar3->pWFunc;
      pcVar2 = pFVar1->zName;
      if (pcVar2 == "nth_value" || pcVar2 == "first_value") {
        iVar5 = pWVar3->csrApp;
        iVar10 = pParse_00->nLabel + -1;
        pParse_00->nLabel = iVar10;
        if (pParse_00->nTempReg == '\0') {
          iVar11 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar11;
        }
        else {
          bVar4 = pParse_00->nTempReg - 1;
          pParse_00->nTempReg = bVar4;
          iVar11 = pParse_00->aTempReg[bVar4];
        }
        sqlite3VdbeAddOp3(p_00,0x4b,0,pWVar3->regResult,0);
        if (pFVar1->zName == "nth_value") {
          sqlite3VdbeAddOp3(p_00,0x5e,pMWin->iEphCsr,pWVar3->iArgCol + 1,iVar11);
          windowCheckValue(pParse_00,iVar11,2);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x47,1,iVar11,0);
        }
        sqlite3VdbeAddOp3(p_00,0x6a,iVar11,pWVar3->regApp,iVar11);
        sqlite3VdbeAddOp3(p_00,0x36,pWVar3->regApp + 1,iVar10,iVar11);
        sqlite3VdbeAddOp3(p_00,0x1e,iVar5,0,iVar11);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar5,pWVar3->iArgCol,pWVar3->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar10);
        if (iVar11 != 0) {
          bVar4 = pParse_00->nTempReg;
joined_r0x001a96af:
          if (bVar4 < 8) {
            pParse_00->nTempReg = bVar4 + 1;
            pParse_00->aTempReg[bVar4] = iVar11;
          }
        }
      }
      else if (pcVar2 == "lead" || pcVar2 == "lag") {
        iVar5 = ((pWVar3->pOwner->x).pList)->nExpr;
        iVar10 = pWVar3->csrApp;
        iVar12 = pParse_00->nLabel + -1;
        pParse_00->nLabel = iVar12;
        if (pParse_00->nTempReg == '\0') {
          iVar11 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar11;
        }
        else {
          bVar4 = pParse_00->nTempReg - 1;
          pParse_00->nTempReg = bVar4;
          iVar11 = pParse_00->aTempReg[bVar4];
        }
        iVar9 = pMWin->iEphCsr;
        if (iVar5 < 3) {
          iVar7 = pWVar3->regResult;
          op = 0x4b;
          p3 = 0;
          p1 = 0;
        }
        else {
          p3 = pWVar3->regResult;
          iVar7 = pWVar3->iArgCol + 2;
          op = 0x5e;
          p1 = iVar9;
        }
        sqlite3VdbeAddOp3(p_00,op,p1,iVar7,p3);
        sqlite3VdbeAddOp3(p_00,0x87,iVar9,iVar11,0);
        pcVar2 = pFVar1->zName;
        if (iVar5 < 2) {
          sqlite3VdbeAddOp3(p_00,0x56,iVar11,((pcVar2 == "lead") - 1) + (uint)(pcVar2 == "lead"),0);
        }
        else {
          if (pParse_00->nTempReg == '\0') {
            iVar5 = pParse_00->nMem + 1;
            pParse_00->nMem = iVar5;
          }
          else {
            bVar4 = pParse_00->nTempReg - 1;
            pParse_00->nTempReg = bVar4;
            iVar5 = pParse_00->aTempReg[bVar4];
          }
          sqlite3VdbeAddOp3(p_00,0x5e,iVar9,pWVar3->iArgCol + 1,iVar5);
          sqlite3VdbeAddOp3(p_00,pcVar2 == "lead" ^ 0x6b,iVar5,iVar11,iVar11);
          if (iVar5 != 0) {
            bVar4 = pParse_00->nTempReg;
            if ((ulong)bVar4 < 8) {
              pParse_00->nTempReg = bVar4 + 1;
              pParse_00->aTempReg[bVar4] = iVar5;
            }
          }
        }
        sqlite3VdbeAddOp3(p_00,0x1e,iVar10,iVar12,iVar11);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar10,pWVar3->iArgCol,pWVar3->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar12);
        if (iVar11 != 0) {
          bVar4 = pParse_00->nTempReg;
          goto joined_r0x001a96af;
        }
      }
    }
    goto LAB_001a9afe;
  }
  if (pMWin->pOrderBy == (ExprList *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = pMWin->pOrderBy->nExpr;
  }
  iVar10 = pMWin->csrApp;
  iVar12 = pParse_00->nLabel;
  iVar5 = iVar12 + -2;
  pParse_00->nLabel = iVar5;
  if (pParse_00->nTempReg == '\0') {
    local_6c = pParse_00->nMem + 1;
    pParse_00->nMem = local_6c;
  }
  else {
    bVar4 = pParse_00->nTempReg - 1;
    pParse_00->nTempReg = bVar4;
    local_6c = pParse_00->aTempReg[bVar4];
  }
  if (pParse_00->nTempReg == '\0') {
    local_68 = pParse_00->nMem + 1;
    pParse_00->nMem = local_68;
  }
  else {
    bVar4 = pParse_00->nTempReg - 1;
    pParse_00->nTempReg = bVar4;
    local_68 = pParse_00->aTempReg[bVar4];
  }
  if (local_70 == 0) {
    local_54 = 0;
    local_64 = 0;
  }
  else {
    local_64 = sqlite3GetTempRange(pParse_00,local_70);
    local_54 = sqlite3GetTempRange(pParse_00,local_70);
  }
  sqlite3VdbeAddOp3(p_00,0x87,pMWin->iEphCsr,local_6c,0);
  windowReadPeerValues(p,pMWin->iEphCsr,local_64);
  for (; pWVar3 != (Window *)0x0; pWVar3 = pWVar3->pNextWin) {
    sqlite3VdbeAddOp3(p_00,0x4b,0,pWVar3->regAccum,0);
  }
  iVar12 = iVar12 + -1;
  sqlite3VdbeAddOp3(p_00,0x17,iVar10,iVar5,pMWin->regStartRowid);
  iVar11 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x87,iVar10,local_68,0);
  sqlite3VdbeAddOp3(p_00,0x36,pMWin->regEndRowid,iVar5,local_68);
  if (pMWin->eExclude != 'B') {
    if (pMWin->eExclude == 'U') {
      sqlite3VdbeAddOp3(p_00,0x35,local_6c,iVar12,local_68);
    }
    else {
      iVar5 = 0;
      if (pMWin->pOrderBy == (ExprList *)0x0) {
        p_01 = (KeyInfo *)0x0;
      }
      else {
        p_01 = sqlite3KeyInfoFromExprList(pParse_00,pMWin->pOrderBy,0,0);
      }
      if (pMWin->eExclude == '^') {
        iVar5 = sqlite3VdbeAddOp3(p_00,0x35,local_6c,0,local_68);
      }
      if (p_01 == (KeyInfo *)0x0) {
        iVar7 = 9;
        iVar9 = 0;
      }
      else {
        windowReadPeerValues(p,iVar10,local_54);
        sqlite3VdbeAddOp3(p_00,0x5a,local_54,local_64,local_70);
        if (p_00->db->mallocFailed == '\0') {
          pOVar8 = p_00->aOp;
          iVar9 = p_00->nOp;
          pOVar8[(long)iVar9 + -1].p4type = -8;
          pOVar8[(long)iVar9 + -1].p4.pKeyInfo = p_01;
        }
        else if ((p_00->db->pnBytesFreed == (int *)0x0) &&
                (p_01->nRef = p_01->nRef - 1, p_01->nRef == 0)) {
          sqlite3DbNNFreeNN(p_01->db,p_01);
        }
        iVar9 = p_00->nOp + 1;
        iVar7 = 0xe;
      }
      sqlite3VdbeAddOp3(p_00,iVar7,iVar9,iVar12,iVar9);
      if (iVar5 != 0) {
        if (p_00->db->mallocFailed == '\0') {
          pOVar8 = p_00->aOp + iVar5;
        }
        else {
          pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar8->p2 = p_00->nOp;
      }
    }
  }
  windowAggStep(p,pMWin,iVar10,0,p->regArg);
  sqlite3VdbeResolveLabel(p_00,iVar12);
  sqlite3VdbeAddOp3(p_00,0x27,iVar10,iVar11,0);
  iVar5 = p_00->nOp;
  if (p_00->db->mallocFailed == '\0') {
    pOVar8 = p_00->aOp + (long)iVar11 + 1;
    p_00->aOp[(long)iVar11 + -1].p2 = iVar5;
  }
  else {
    pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
    DAT_0021b448 = iVar5;
  }
  pOVar8->p2 = iVar5;
  if (local_68 != 0) {
    bVar4 = pParse_00->nTempReg;
    if ((ulong)bVar4 < 8) {
      pParse_00->nTempReg = bVar4 + 1;
      pParse_00->aTempReg[bVar4] = local_68;
    }
  }
  if (local_6c != 0) {
    bVar4 = pParse_00->nTempReg;
    if ((ulong)bVar4 < 8) {
      pParse_00->nTempReg = bVar4 + 1;
      pParse_00->aTempReg[bVar4] = local_6c;
    }
  }
  if (local_70 != 0) {
    if (local_70 == 1) {
      if (local_54 != 0) {
        bVar4 = pParse_00->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse_00->nTempReg = bVar4 + 1;
          piVar6 = pParse_00->aTempReg + bVar4;
          goto LAB_001a9aa6;
        }
      }
    }
    else if (pParse_00->nRangeReg < local_70) {
      pParse_00->nRangeReg = local_70;
      piVar6 = &pParse_00->iRangeReg;
LAB_001a9aa6:
      *piVar6 = local_54;
    }
    if (local_70 == 1) {
      if (local_64 != 0) {
        bVar4 = pParse_00->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse_00->nTempReg = bVar4 + 1;
          piVar6 = pParse_00->aTempReg + bVar4;
          goto LAB_001a9aeb;
        }
      }
    }
    else if (pParse_00->nRangeReg < local_70) {
      pParse_00->nRangeReg = local_70;
      piVar6 = &pParse_00->iRangeReg;
LAB_001a9aeb:
      *piVar6 = local_64;
    }
  }
  windowAggFinal(p,1);
LAB_001a9afe:
  sqlite3VdbeAddOp3(p_00,10,p->regGosub,p->addrGosub,0);
  return;
}

Assistant:

static void windowReturnOneRow(WindowCodeArg *p){
  Window *pMWin = p->pMWin;
  Vdbe *v = p->pVdbe;

  if( pMWin->regStartRowid ){
    windowFullScan(p);
  }else{
    Parse *pParse = p->pParse;
    Window *pWin;

    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      FuncDef *pFunc = pWin->pWFunc;
      assert( ExprUseXList(pWin->pOwner) );
      if( pFunc->zName==nth_valueName
       || pFunc->zName==first_valueName
      ){
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);

        if( pFunc->zName==nth_valueName ){
          sqlite3VdbeAddOp3(v, OP_Column,pMWin->iEphCsr,pWin->iArgCol+1,tmpReg);
          windowCheckValue(pParse, tmpReg, 2);
        }else{
          sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
        }
        sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
        sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
        VdbeCoverageNeverNull(v);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
      else if( pFunc->zName==leadName || pFunc->zName==lagName ){
        int nArg = pWin->pOwner->x.pList->nExpr;
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        int iEph = pMWin->iEphCsr;

        if( nArg<3 ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
        }else{
          sqlite3VdbeAddOp3(v, OP_Column, iEph,pWin->iArgCol+2,pWin->regResult);
        }
        sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
        if( nArg<2 ){
          int val = (pFunc->zName==leadName ? 1 : -1);
          sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
        }else{
          int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
          int tmpReg2 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
          sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
          sqlite3ReleaseTempReg(pParse, tmpReg2);
        }

        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
        VdbeCoverage(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, p->regGosub, p->addrGosub);
}